

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O2

bool __thiscall draco::MetadataDecoder::DecodeMetadata(MetadataDecoder *this,Metadata *metadata)

{
  pointer pMVar1;
  int iVar2;
  pointer pMVar3;
  pointer pMVar4;
  bool bVar5;
  _Head_base<0UL,_draco::Metadata_*,_false> this_00;
  ulong uVar6;
  uint uVar7;
  uint32_t i;
  uint32_t num_sub_metadata;
  uint32_t num_entries;
  __uniq_ptr_impl<draco::Metadata,_std::default_delete<draco::Metadata>_> local_88;
  Metadata *local_80;
  string sub_metadata_name;
  vector<MetadataTuple,_std::allocator<MetadataTuple>_> metadata_stack;
  
  metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sub_metadata_name._M_dataplus._M_p = (pointer)0x0;
  sub_metadata_name.field_2._M_allocated_capacity._0_4_ = 0;
  sub_metadata_name._M_string_length = (size_type)metadata;
  std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::push_back
            (&metadata_stack,(value_type *)&sub_metadata_name);
  while (pMVar4 = metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>.
                  _M_impl.super__Vector_impl_data._M_finish,
        pMVar3 = metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
        super__Vector_impl_data._M_start !=
        metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    pMVar1 = metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
    local_80 = metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].parent_metadata;
    this_00._M_head_impl =
         metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].decoded_metadata;
    iVar2 = metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl
            .super__Vector_impl_data._M_finish[-1].level;
    metadata_stack.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar1;
    if (local_80 != (Metadata *)0x0) {
      if (1000 < iVar2) break;
      sub_metadata_name._M_dataplus._M_p = (pointer)&sub_metadata_name.field_2;
      sub_metadata_name._M_string_length = 0;
      sub_metadata_name.field_2._M_allocated_capacity._0_4_ =
           sub_metadata_name.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      bVar5 = DecodeName(this,&sub_metadata_name);
      if (bVar5) {
        this_00._M_head_impl = (Metadata *)operator_new(0x60);
        Metadata::Metadata(this_00._M_head_impl);
        _num_entries = (Metadata *)0x0;
        local_88._M_t.
        super__Tuple_impl<0UL,_draco::Metadata_*,_std::default_delete<draco::Metadata>_>.
        super__Head_base<0UL,_draco::Metadata_*,_false>._M_head_impl =
             (tuple<draco::Metadata_*,_std::default_delete<draco::Metadata>_>)
             (tuple<draco::Metadata_*,_std::default_delete<draco::Metadata>_>)this_00._M_head_impl;
        bVar5 = Metadata::AddSubMetadata
                          (local_80,&sub_metadata_name,
                           (unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                           &local_88);
        std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>::~unique_ptr
                  ((unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)&local_88);
        std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>::~unique_ptr
                  ((unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                   &num_entries);
      }
      else {
        bVar5 = false;
      }
      std::__cxx11::string::~string((string *)&sub_metadata_name);
      if (bVar5 == false) break;
    }
    if (this_00._M_head_impl == (Metadata *)0x0) break;
    _num_entries = _num_entries & 0xffffffff00000000;
    bVar5 = DecodeVarint<unsigned_int>(&num_entries,this->buffer_);
    if (!bVar5) break;
    uVar7 = 0xffffffff;
    while( true ) {
      uVar7 = uVar7 + 1;
      if (num_entries <= uVar7) break;
      bVar5 = DecodeEntry(this,this_00._M_head_impl);
      if (!bVar5) goto LAB_0012f038;
    }
    num_sub_metadata = 0;
    bVar5 = DecodeVarint<unsigned_int>(&num_sub_metadata,this->buffer_);
    if ((!bVar5) ||
       (uVar6 = (ulong)num_sub_metadata,
       this->buffer_->data_size_ - this->buffer_->pos_ < (long)uVar6)) break;
    bVar5 = local_80 == (Metadata *)0x0;
    for (uVar7 = 0; uVar7 < (uint)uVar6; uVar7 = uVar7 + 1) {
      sub_metadata_name._M_string_length = 0;
      sub_metadata_name._M_dataplus._M_p = (pointer)this_00._M_head_impl;
      sub_metadata_name.field_2._M_allocated_capacity._0_4_ = (iVar2 + 1) - (uint)bVar5;
      std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::push_back
                (&metadata_stack,(value_type *)&sub_metadata_name);
      uVar6 = (ulong)num_sub_metadata;
    }
  }
LAB_0012f038:
  std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::~vector(&metadata_stack);
  return pMVar3 == pMVar4;
}

Assistant:

bool MetadataDecoder::DecodeMetadata(Metadata *metadata) {
  // Limit metadata nesting depth to avoid stack overflow in destructor.
  constexpr int kMaxSubmetadataLevel = 1000;

  struct MetadataTuple {
    Metadata *parent_metadata;
    Metadata *decoded_metadata;
    int level;
  };
  std::vector<MetadataTuple> metadata_stack;
  metadata_stack.push_back({nullptr, metadata, 0});
  while (!metadata_stack.empty()) {
    const MetadataTuple mp = metadata_stack.back();
    metadata_stack.pop_back();
    metadata = mp.decoded_metadata;

    if (mp.parent_metadata != nullptr) {
      if (mp.level > kMaxSubmetadataLevel) {
        return false;
      }
      std::string sub_metadata_name;
      if (!DecodeName(&sub_metadata_name)) {
        return false;
      }
      std::unique_ptr<Metadata> sub_metadata =
          std::unique_ptr<Metadata>(new Metadata());
      metadata = sub_metadata.get();
      if (!mp.parent_metadata->AddSubMetadata(sub_metadata_name,
                                              std::move(sub_metadata))) {
        return false;
      }
    }
    if (metadata == nullptr) {
      return false;
    }

    uint32_t num_entries = 0;
    if (!DecodeVarint(&num_entries, buffer_)) {
      return false;
    }
    for (uint32_t i = 0; i < num_entries; ++i) {
      if (!DecodeEntry(metadata)) {
        return false;
      }
    }
    uint32_t num_sub_metadata = 0;
    if (!DecodeVarint(&num_sub_metadata, buffer_)) {
      return false;
    }
    if (num_sub_metadata > buffer_->remaining_size()) {
      // The decoded number of metadata items is unreasonably high.
      return false;
    }
    for (uint32_t i = 0; i < num_sub_metadata; ++i) {
      metadata_stack.push_back(
          {metadata, nullptr, mp.parent_metadata ? mp.level + 1 : mp.level});
    }
  }
  return true;
}